

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

int (anonymous_namespace)::store_int<unsigned_long,char>
              (unsigned_long *out,char *val,unsigned_long min,unsigned_long max)

{
  int *piVar1;
  ulong uVar2;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RDI;
  long val_as_long;
  char *in_stack_ffffffffffffffd0;
  int local_4;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = anon_unknown.dwarf_9e99::to_long(in_stack_ffffffffffffffd0);
  if ((uVar2 == 0) && (piVar1 = __errno_location(), *piVar1 != 0)) {
    return 3;
  }
  if ((uVar2 < in_RDX) || (uVar2 == 0x8000000000000000)) {
    local_4 = 2;
  }
  else if ((in_RCX < uVar2) || (uVar2 == 0x7fffffffffffffff)) {
    local_4 = 2;
  }
  else {
    *in_RDI = uVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int store_int(INT_T *out, const CHAR_T *val, INT_T min, INT_T max)
{
    errno = 0;
    long val_as_long = to_long(val);
    if (val_as_long == 0 && errno != 0)
        return __CILKRTS_SET_PARAM_INVALID;
    if (val_as_long < min || val_as_long == LONG_MIN)
        return __CILKRTS_SET_PARAM_XRANGE;
    else if (val_as_long > max || val_as_long == LONG_MAX)
        return __CILKRTS_SET_PARAM_XRANGE;

    *out = val_as_long;
    return __CILKRTS_SET_PARAM_SUCCESS;
}